

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O3

bool Dijkstra(DAG *_Dag)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  iterator iVar5;
  _Self __tmp;
  _List_node_base *p_Var6;
  iterator next;
  iterator loc;
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  _minHeap;
  value_type local_70;
  value_type local_68;
  key_type local_60;
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  local_58;
  int iVar4;
  
  local_58.c.
  super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_current =
       (_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_68._M_current = local_70._M_current;
  std::
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ::push(&local_58,&local_68);
  (local_68._M_current)->visited = true;
  do {
    local_68._M_current =
         (local_58.c.
          super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_current;
    std::
    priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
    ::pop(&local_58);
    if (local_68._M_current <
        (_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var6 = ((local_68._M_current)->nextPos).
               super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (p_Var6 == (_List_node_base *)&(local_68._M_current)->nextPos) {
        local_70._M_current = local_68._M_current + 1;
        if (local_68._M_current[1].visited == false) {
          std::
          priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
          ::push(&local_58,&local_70);
          (local_70._M_current)->visited = true;
        }
      }
      else {
        uVar2 = (local_68._M_current)->Weight;
        do {
          bVar1 = *(byte *)&p_Var6[1]._M_next;
          local_60.first =
               (int)((ulong)((long)local_68._M_current -
                            (long)(_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
          local_60.second = (int)bVar1;
          iVar5 = std::
                  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_unsigned_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_unsigned_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_unsigned_int>_>_>
                  ::find(&PathWeight._M_t,&local_60);
          if ((_Rb_tree_header *)iVar5._M_node == &PathWeight._M_t._M_impl.super__Rb_tree_header) {
            iVar4 = 0;
          }
          else {
            iVar4 = *(int *)&iVar5._M_node[1]._M_parent;
          }
          uVar3 = iVar4 + uVar2;
          local_70._M_current = local_68._M_current + bVar1;
          if (uVar3 < (local_70._M_current)->Weight) {
            (local_70._M_current)->Weight = uVar3;
            (local_70._M_current)->prev =
                 (int)((ulong)((long)local_68._M_current -
                              (long)(_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
          }
          if ((local_70._M_current)->visited == false) {
            std::
            priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
            ::push(&local_58,&local_70);
            (local_70._M_current)->visited = true;
          }
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != (_List_node_base *)&(local_68._M_current)->nextPos);
      }
    }
  } while (local_58.c.
           super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_58.c.
           super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  if (local_58.c.
      super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.
                    super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool Dijkstra(DAG &_Dag)
{
    priority_queue<vector<DAG_node>::iterator> _minHeap;
    auto loc = _Dag.begin();
    auto next = loc;
    int j;
    uint32_t curW, nextW;
    list<uint8_t>::iterator iter;
    _minHeap.push(loc);
    loc->visited = true;
    do {
        loc = _minHeap.top();
        _minHeap.pop();
        if (loc >= _Dag.end()) continue;
        if (loc->nextPos.empty()) {
           next = loc + 1;
           if (! next->visited) {
             _minHeap.push(next);
             next->visited = true;
           }
           continue;
        }
        curW = loc->Weight;
        for (iter = loc->nextPos.begin(); iter != loc->nextPos.end(); iter++) {
             j = *iter;
             nextW = curW + getPathWeight(int(loc-_Dag.begin()), j);
             next = loc + j;
             if (nextW < next->Weight) {
                 next->Weight = nextW;
                 next->prev = int(loc - _Dag.begin());
             }
             if ( ! next->visited ) {
                _minHeap.push(next);
                next->visited = true;
             }
        }

    } while ( ! _minHeap.empty() );
    return true;
}